

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::at<std::__cxx11::string>
          (Map<std::__cxx11::string,std::__cxx11::string> *this,
          key_arg<std::__cxx11::basic_string<char>_> *key)

{
  bool bVar1;
  LogMessage *pLVar2;
  pointer pvVar3;
  string local_98;
  byte local_61;
  LogMessage local_60;
  Voidify local_49;
  const_iterator local_48;
  undefined1 local_30 [8];
  const_iterator it;
  key_arg<std::__cxx11::basic_string<char>_> *key_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  it.super_UntypedMapIterator._16_8_ = key;
  find<std::__cxx11::string>((const_iterator *)local_30,this,key);
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::end(&local_48,
        (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)this);
  bVar1 = protobuf::operator!=((const_iterator *)local_30,&local_48);
  local_61 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x4e8,"it != end()");
    local_61 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [16])"key not found: ");
    std::__cxx11::string::string((string *)&local_98,(string *)it.super_UntypedMapIterator._16_8_);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,&local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar2);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_61 & 1) == 0) {
    pvVar3 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::const_iterator::operator->((const_iterator *)local_30);
    return &pvVar3->second;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

const T& at(const key_arg<K>& key) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    const_iterator it = find(key);
    ABSL_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }